

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextGLImpl::EndQuery(DeviceContextGLImpl *this,IQuery *pQuery)

{
  QueryGLImpl *pQVar1;
  GLenum err;
  string msg;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::EndQuery
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,pQuery,0);
  pQVar1 = ClassPtrCast<Diligent::QueryGLImpl,Diligent::IQuery>(pQuery);
  switch((pQVar1->super_QueryBase<Diligent::EngineGLImplTraits>).
         super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
         .m_Desc.Type) {
  case QUERY_TYPE_OCCLUSION:
    (*__glewEndQuery)(0x8914);
    err = glGetError();
    if (err == 0) {
      return;
    }
    LogError<false,char[38],char[17],unsigned_int>
              (false,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x672,(char (*) [38])"Failed to end GL_SAMPLES_PASSED query",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x672);
    break;
  case QUERY_TYPE_BINARY_OCCLUSION:
    (*__glewEndQuery)(0x8c2f);
    err = glGetError();
    if (err == 0) {
      return;
    }
    LogError<false,char[42],char[17],unsigned_int>
              (false,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x678,(char (*) [42])"Failed to end GL_ANY_SAMPLES_PASSED query",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x678);
    break;
  case QUERY_TYPE_TIMESTAMP:
    if (__glewQueryCounter == (PFNGLQUERYCOUNTERPROC)0x0) {
      if (EndQuery(Diligent::IQuery*)::IsFirstTime != '\0') {
        return;
      }
      FormatString<char[47]>(&msg,(char (*) [47])"Timer queries are not supported by this device");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
      EndQuery(Diligent::IQuery*)::IsFirstTime = '\x01';
      return;
    }
    (*__glewQueryCounter)
              (*(GLuint *)&(pQVar1->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44,0x8e28
              );
    err = glGetError();
    if (err == 0) {
      return;
    }
    LogError<false,char[22],char[17],unsigned_int>
              (false,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x687,(char (*) [22])"glQueryCounter failed",(char (*) [17])"\nGL Error Code: ",&err
              );
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x687);
    break;
  case QUERY_TYPE_PIPELINE_STATISTICS:
    (*__glewEndQuery)(0x8c87);
    err = glGetError();
    if (err == 0) {
      return;
    }
    LogError<false,char[44],char[17],unsigned_int>
              (false,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x67e,(char (*) [44])"Failed to end GL_PRIMITIVES_GENERATED query",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x67e);
    break;
  case QUERY_TYPE_DURATION:
    (*__glewEndQuery)(0x88bf);
    err = glGetError();
    if (err == 0) {
      return;
    }
    LogError<false,char[36],char[17],unsigned_int>
              (false,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x693,(char (*) [36])"Failed to end GL_TIME_ELAPSED query",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x693);
    break;
  default:
    FormatString<char[22]>(&msg,(char (*) [22])"Unexpected query type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x69a);
  }
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void DeviceContextGLImpl::EndQuery(IQuery* pQuery)
{
    TDeviceContextBase::EndQuery(pQuery, 0);

    QueryGLImpl* pQueryGLImpl = ClassPtrCast<QueryGLImpl>(pQuery);
    QUERY_TYPE   QueryType    = pQueryGLImpl->GetDesc().Type;
    switch (QueryType)
    {
        case QUERY_TYPE_OCCLUSION:
#if GL_SAMPLES_PASSED
            glEndQuery(GL_SAMPLES_PASSED);
            DEV_CHECK_GL_ERROR("Failed to end GL_SAMPLES_PASSED query");
#endif
            break;

        case QUERY_TYPE_BINARY_OCCLUSION:
            glEndQuery(GL_ANY_SAMPLES_PASSED);
            DEV_CHECK_GL_ERROR("Failed to end GL_ANY_SAMPLES_PASSED query");
            break;

        case QUERY_TYPE_PIPELINE_STATISTICS:
#if GL_PRIMITIVES_GENERATED
            glEndQuery(GL_PRIMITIVES_GENERATED);
            DEV_CHECK_GL_ERROR("Failed to end GL_PRIMITIVES_GENERATED query");
#endif
            break;

        case QUERY_TYPE_TIMESTAMP:
#if GL_TIMESTAMP
            if (glQueryCounter != nullptr)
            {
                glQueryCounter(pQueryGLImpl->GetGlQueryHandle(), GL_TIMESTAMP);
                DEV_CHECK_GL_ERROR("glQueryCounter failed");
            }
            else
#endif
            {
                LOG_ERROR_MESSAGE_ONCE("Timer queries are not supported by this device");
            }
            break;

        case QUERY_TYPE_DURATION:
#if GL_TIME_ELAPSED
            glEndQuery(GL_TIME_ELAPSED);
            DEV_CHECK_GL_ERROR("Failed to end GL_TIME_ELAPSED query");
#else
            LOG_ERROR_MESSAGE_ONCE("Duration queries are not supported by this device");
#endif
            break;

        default:
            UNEXPECTED("Unexpected query type");
    }
}